

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O2

char * cram_get_ref(cram_fd *fd,int id,int start,int end)

{
  pthread_mutex_t *__mutex;
  ref_entry **pprVar1;
  size_t __n;
  long lVar2;
  int iVar3;
  SAM_hdr_type *type;
  SAM_hdr_tag *pSVar4;
  mFILE *mf;
  char *pcVar5;
  FILE *__s;
  int *piVar6;
  refs_t *prVar7;
  size_t sVar8;
  ref_entry *prVar9;
  BGZF *pBVar10;
  char *pcVar11;
  uint uVar12;
  ref_entry *e;
  char *local_30f8;
  char *local_30e8;
  stat sb;
  char path [4096];
  char path_tmp [4096];
  char cache [4096];
  
  if (id == -1) {
    return (char *)0x0;
  }
  __mutex = &fd->ref_lock;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (fd->unsorted != 0) {
    fd->shared_ref = 1;
  }
  prVar7 = fd->refs;
  if (id < prVar7->nref) {
    e = prVar7->ref_id[id];
    if (e == (ref_entry *)0x0) goto LAB_0012660b;
    pthread_mutex_lock((pthread_mutex_t *)&prVar7->lock);
    if (e->length != 0) {
LAB_00126ae5:
      if (start < 1) {
        __assert_fail("start >= 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_io.c"
                      ,0x934,"char *cram_get_ref(cram_fd *, int, int, int)");
      }
      lVar2 = e->length;
      iVar3 = (int)lVar2;
      if (end < 1) {
        end = iVar3;
      }
      if (lVar2 <= end) {
        end = iVar3;
      }
      uVar12 = start;
      if ((double)lVar2 * 0.5 <= (double)(end - start)) {
        end = iVar3;
        uVar12 = 1;
      }
      if (((fd->shared_ref != 0) || (e->seq != (char *)0x0)) || ((uVar12 == 1 && (lVar2 == end)))) {
        if (id < 0) {
          fd->ref = (char *)0x0;
          prVar7 = fd->refs;
          pcVar5 = (char *)0x0;
        }
        else {
          prVar7 = fd->refs;
          if (e->seq == (char *)0x0) {
            prVar9 = cram_ref_load(prVar7,id);
            if (prVar9 == (ref_entry *)0x0) goto LAB_00126cd3;
            if (fd->unsorted != 0) {
              prVar7 = fd->refs;
              goto LAB_00126b60;
            }
          }
          else {
LAB_00126b60:
            cram_ref_incr_locked(prVar7,id);
          }
          fd->ref = (char *)0x0;
          fd->ref_start = 1;
          fd->ref_end = (int)e->length;
          fd->ref_id = id;
          prVar7 = fd->refs;
          pcVar5 = prVar7->ref_id[id]->seq + ((ulong)(uint)start - 1);
        }
        pthread_mutex_unlock((pthread_mutex_t *)&prVar7->lock);
        goto LAB_00126bbb;
      }
      if (id < 0) {
        if (fd->ref_free != (char *)0x0) {
          free(fd->ref_free);
          fd->ref_free = (char *)0x0;
        }
        fd->ref = (char *)0x0;
        fd->ref_id = id;
      }
      else {
        prVar7 = fd->refs;
        pcVar5 = e->fn;
        pcVar11 = pcVar5;
        iVar3 = strcmp(prVar7->fn,pcVar5);
        pBVar10 = prVar7->fp;
        if (iVar3 == 0) {
          if (pBVar10 == (BGZF *)0x0) goto LAB_00126c56;
        }
        else {
          if (pBVar10 != (BGZF *)0x0) {
            iVar3 = bgzf_close(pBVar10);
            if (iVar3 != 0) {
              return (char *)0x0;
            }
            pcVar5 = e->fn;
            prVar7 = fd->refs;
          }
LAB_00126c56:
          prVar7->fn = pcVar5;
          pBVar10 = bgzf_open_ref(pcVar5,pcVar11);
          prVar7 = fd->refs;
          prVar7->fp = pBVar10;
          if (pBVar10 == (BGZF *)0x0) goto LAB_00126cdb;
        }
        pcVar5 = load_ref_portion(pBVar10,e,uVar12,end);
        fd->ref = pcVar5;
        if (pcVar5 != (char *)0x0) {
          free(fd->ref_free);
          fd->ref_id = id;
          fd->ref_start = uVar12;
          fd->ref_end = end;
          pcVar5 = fd->ref;
          fd->ref_free = pcVar5;
          pthread_mutex_unlock((pthread_mutex_t *)&fd->refs->lock);
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          return pcVar5 + ((ulong)(uint)start - (ulong)uVar12);
        }
      }
LAB_00126cd3:
      prVar7 = fd->refs;
LAB_00126cdb:
      pthread_mutex_unlock((pthread_mutex_t *)&prVar7->lock);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return (char *)0x0;
    }
    local_30e8 = getenv("REF_PATH");
    local_30f8 = getenv("REF_CACHE");
    if (fd->verbose != 0) {
      fprintf(_stderr,"cram_populate_ref on fd %p, id %d\n",fd,(ulong)(uint)id);
    }
    if ((local_30e8 == (char *)0x0) || (*local_30e8 == '\0')) {
      if ((local_30f8 == (char *)0x0) || (*local_30f8 == '\0')) {
        pcVar5 = getenv("XDG_CACHE_HOME");
        if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
          pcVar5 = getenv("HOME");
          if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
            pcVar5 = getenv("TMPDIR");
            if (((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) &&
               ((pcVar5 = getenv("TEMP"), pcVar5 == (char *)0x0 || (*pcVar5 == '\0')))) {
              pcVar5 = "/tmp";
            }
            pcVar11 = "";
          }
          else {
            pcVar11 = "/.cache";
          }
        }
        else {
          pcVar11 = "";
        }
        local_30f8 = cache;
        snprintf(local_30f8,0x1000,"%s%s/hts-ref/%%2s/%%2s/%%s",pcVar5,pcVar11);
        local_30e8 = "http://www.ebi.ac.uk:80/ena/cram/md5/%s";
        if (fd->verbose != 0) {
          local_30f8 = cache;
          fprintf(_stderr,"Populating local cache: %s\n");
        }
      }
      else {
        local_30e8 = "http://www.ebi.ac.uk:80/ena/cram/md5/%s";
      }
    }
    if ((e->name != (char *)0x0) &&
       (type = sam_hdr_find(fd->header,"SQ","SN",e->name), type != (SAM_hdr_type *)0x0)) {
      pSVar4 = sam_hdr_find_key(fd->header,type,"M5",(SAM_hdr_tag **)0x0);
      if (pSVar4 != (SAM_hdr_tag *)0x0) {
        if (fd->verbose != 0) {
          fprintf(_stderr,"Querying ref %s\n",pSVar4->str + 3);
        }
        if ((local_30f8 == (char *)0x0) || (*local_30f8 == '\0')) {
LAB_0012676d:
          mf = open_path_mfile(pSVar4->str + 3,local_30e8,(char *)0x0);
          if (mf == (mFILE *)0x0) goto LAB_00126869;
          pcVar5 = (char *)mfsteal(mf,&sb.st_dev);
          e->seq = pcVar5;
          e->length = sb.st_dev;
          if ((local_30f8 != (char *)0x0) && (*local_30f8 != '\0')) {
            expand_cache_path(path,local_30f8,pSVar4->str + 3);
            if (fd->verbose != 0) {
              fprintf(_stderr,"Path=\'%s\'\n",path);
            }
            mkdir_prefix(path,0x3ff);
            uVar12 = 0;
            do {
              sprintf(path_tmp,"%s.tmp_%d",path,(ulong)uVar12);
              __s = fopen(path_tmp,"wx");
              if (__s != (FILE *)0x0) {
                __n = e->length;
                sVar8 = fwrite(e->seq,1,__n,__s);
                if (__n != sVar8) {
                  perror(path);
                }
                iVar3 = paranoid_fclose((FILE *)__s);
                if ((iVar3 == -1) || (iVar3 = chmod(path_tmp,0x124), iVar3 != 0)) {
                  unlink(path_tmp);
                }
                else {
                  rename(path_tmp,path);
                }
                goto LAB_00126ac7;
              }
              uVar12 = uVar12 + 1;
              piVar6 = __errno_location();
            } while (*piVar6 == 0x11);
            perror(path_tmp);
          }
        }
        else {
          expand_cache_path(path,local_30f8,pSVar4->str + 3);
          iVar3 = stat(path,(stat *)&sb);
          if ((iVar3 != 0) || (pBVar10 = bgzf_open(path,"r"), pBVar10 == (BGZF *)0x0))
          goto LAB_0012676d;
          e->length = sb.st_size;
          e->offset = 0;
          e->bases_per_line = 0;
          e->line_length = 0;
          pcVar5 = string_dup(fd->refs->pool,path);
          e->fn = pcVar5;
          prVar7 = fd->refs;
          if (prVar7->fp != (BGZF *)0x0) {
            iVar3 = bgzf_close(prVar7->fp);
            if (iVar3 != 0) goto LAB_00126934;
            prVar7 = fd->refs;
            pcVar5 = e->fn;
          }
          prVar7->fp = pBVar10;
          prVar7->fn = pcVar5;
        }
LAB_00126ac7:
        e = fd->refs->ref_id[id];
        if (fd->unsorted != 0) {
          cram_ref_incr_locked(fd->refs,id);
        }
        goto LAB_00126ae5;
      }
LAB_00126869:
      pSVar4 = sam_hdr_find_key(fd->header,type,"UR",(SAM_hdr_tag **)0x0);
      if (pSVar4 != (SAM_hdr_tag *)0x0) {
        pcVar11 = pSVar4->str;
        pcVar5 = pcVar11 + 3;
        iVar3 = strncmp(pcVar5,"file:",5);
        pcVar11 = pcVar11 + 8;
        if (iVar3 != 0) {
          pcVar11 = pcVar5;
        }
        prVar7 = fd->refs;
        if (prVar7->fp != (BGZF *)0x0) {
          iVar3 = bgzf_close(prVar7->fp);
          if (iVar3 != 0) goto LAB_00126934;
          prVar7 = fd->refs;
          prVar7->fp = (BGZF *)0x0;
        }
        prVar7 = refs_load_fai(prVar7,pcVar11,0);
        if (prVar7 != (refs_t *)0x0) {
          fd->refs = prVar7;
          if (prVar7->fp != (BGZF *)0x0) {
            iVar3 = bgzf_close(prVar7->fp);
            if (iVar3 != 0) goto LAB_00126934;
            prVar7 = fd->refs;
            prVar7->fp = (BGZF *)0x0;
          }
          if ((((prVar7->fn != (char *)0x0) && (iVar3 = refs2id(prVar7,fd->header), iVar3 != -1)) &&
              (pprVar1 = fd->refs->ref_id, pprVar1 != (ref_entry **)0x0)) &&
             (pprVar1[id] != (ref_entry *)0x0)) goto LAB_00126ac7;
        }
      }
    }
LAB_00126934:
    fprintf(_stderr,"Failed to populate reference for id %d\n",(ulong)(uint)id);
    pthread_mutex_unlock((pthread_mutex_t *)&fd->refs->lock);
  }
  else {
LAB_0012660b:
    fprintf(_stderr,"No reference found for id %d\n",(ulong)(uint)id);
  }
  pcVar5 = (char *)0x0;
LAB_00126bbb:
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return pcVar5;
}

Assistant:

char *cram_get_ref(cram_fd *fd, int id, int start, int end) {
    ref_entry *r;
    char *seq;
    int ostart = start;

    if (id == -1)
	return NULL;

    /* FIXME: axiomatic query of r->seq being true?
     * Or shortcut for unsorted data where we load once and never free?
     */

    //fd->shared_ref = 1; // hard code for now to simplify things

    pthread_mutex_lock(&fd->ref_lock);

    RP("%d cram_get_ref on fd %p, id %d, range %d..%d\n", gettid(), fd, id, start, end);

    /*
     * Unsorted data implies we want to fetch an entire reference at a time.
     * We just deal with this at the moment by claiming we're sharing
     * references instead, which has the same requirement.
     */
    if (fd->unsorted)
	fd->shared_ref = 1;


    /* Sanity checking: does this ID exist? */
    if (id >= fd->refs->nref) {
	fprintf(stderr, "No reference found for id %d\n", id);
	pthread_mutex_unlock(&fd->ref_lock);
	return NULL;
    }

    if (!fd->refs || !fd->refs->ref_id[id]) {
	fprintf(stderr, "No reference found for id %d\n", id);
	pthread_mutex_unlock(&fd->ref_lock);
	return NULL;
    }

    if (!(r = fd->refs->ref_id[id])) {
	fprintf(stderr, "No reference found for id %d\n", id);
	pthread_mutex_unlock(&fd->ref_lock);
	return NULL;
    }


    /*
     * It has an entry, but may not have been populated yet.
     * Any manually loaded .fai files have their lengths known.
     * A ref entry computed from @SQ lines (M5 or UR field) will have
     * r->length == 0 unless it's been loaded once and verified that we have
     * an on-disk filename for it.
     *
     * 19 Sep 2013: Moved the lock here as the cram_populate_ref code calls
     * open_path_mfile and libcurl, which isn't multi-thread safe unless I
     * rewrite my code to have one curl handle per thread.
     */
    pthread_mutex_lock(&fd->refs->lock);
    if (r->length == 0) {
	if (cram_populate_ref(fd, id, r) == -1) {
	    fprintf(stderr, "Failed to populate reference for id %d\n", id);
	    pthread_mutex_unlock(&fd->refs->lock);
	    pthread_mutex_unlock(&fd->ref_lock);
	    return NULL;
	}
	r = fd->refs->ref_id[id];
	if (fd->unsorted)
	    cram_ref_incr_locked(fd->refs, id);
    }


    /*
     * We now know that we the filename containing the reference, so check
     * for limits. If it's over half the reference we'll load all of it in
     * memory as this will speed up subsequent calls.
     */
    if (end < 1)
	end = r->length;
    if (end >= r->length)
	end  = r->length; 
    assert(start >= 1);

    if (end - start >= 0.5*r->length || fd->shared_ref) {
	start = 1;
	end = r->length;
    }
    
    /*
     * Maybe we have it cached already? If so use it.
     *
     * Alternatively if we don't have the sequence but we're sharing
     * references and/or are asking for the entire length of it, then
     * load the full reference into the refs structure and return
     * a pointer to that one instead.
     */
    if (fd->shared_ref || r->seq || (start == 1 && end == r->length)) {
	char *cp;

	if (id >= 0) {
	    if (r->seq) {
		cram_ref_incr_locked(fd->refs, id);
	    } else {
		ref_entry *e;
		if (!(e = cram_ref_load(fd->refs, id))) {
		    pthread_mutex_unlock(&fd->refs->lock);
		    pthread_mutex_unlock(&fd->ref_lock);
		    return NULL;
		}

		/* unsorted data implies cache ref indefinitely, to avoid
		 * continually loading and unloading.
		 */
		if (fd->unsorted)
		    cram_ref_incr_locked(fd->refs, id);
	    }	    

	    fd->ref = NULL; /* We never access it directly */
	    fd->ref_start = 1;
	    fd->ref_end   = r->length;
	    fd->ref_id    = id;

	    cp = fd->refs->ref_id[id]->seq + ostart-1;
	} else {
	    fd->ref = NULL;
	    cp = NULL;
	}

	RP("%d cram_get_ref returning for id %d, count %d\n", gettid(), id, (int)r->count);

	pthread_mutex_unlock(&fd->refs->lock);
	pthread_mutex_unlock(&fd->ref_lock);
	return cp;
    }

    /*
     * Otherwise we're not sharing, we don't have a copy of it already and
     * we're only asking for a small portion of it.
     *
     * In this case load up just that segment ourselves, freeing any old
     * small segments in the process.
     */

    /* Unmapped ref ID */
    if (id < 0) {
	if (fd->ref_free) {
	    free(fd->ref_free);
	    fd->ref_free = NULL;
	}
	fd->ref = NULL;
	fd->ref_id = id;
	pthread_mutex_unlock(&fd->refs->lock);
	pthread_mutex_unlock(&fd->ref_lock);
	return NULL;
    }

    /* Open file if it's not already the current open reference */
    if (strcmp(fd->refs->fn, r->fn) || fd->refs->fp == NULL) {
	if (fd->refs->fp)
	    if (bgzf_close(fd->refs->fp) != 0)
		return NULL;
	fd->refs->fn = r->fn;
	if (!(fd->refs->fp = bgzf_open_ref(fd->refs->fn, "r"))) {
	    pthread_mutex_unlock(&fd->refs->lock);
	    pthread_mutex_unlock(&fd->ref_lock);
	    return NULL;
	}
    }

    if (!(fd->ref = load_ref_portion(fd->refs->fp, r, start, end))) {
	pthread_mutex_unlock(&fd->refs->lock);
	pthread_mutex_unlock(&fd->ref_lock);
	return NULL;
    }

    if (fd->ref_free)
	free(fd->ref_free);

    fd->ref_id    = id;
    fd->ref_start = start;
    fd->ref_end   = end;
    fd->ref_free = fd->ref;
    seq = fd->ref;

    pthread_mutex_unlock(&fd->refs->lock);
    pthread_mutex_unlock(&fd->ref_lock);

    return seq + ostart - start;
}